

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue_p.h
# Opt level: O1

QCborValue * __thiscall
QCborContainerPrivate::extractAt
          (QCborValue *__return_storage_ptr__,QCborContainerPrivate *this,qsizetype idx)

{
  anon_union_8_2_4ee71171_for_Element_0 this_00;
  ulong uVar1;
  pointer pEVar2;
  QCborValue *result;
  Element e;
  
  pEVar2 = QList<QtCbor::Element>::data(&this->elements);
  this_00 = (anon_union_8_2_4ee71171_for_Element_0)pEVar2[idx].field_0.container;
  uVar1._0_4_ = pEVar2[idx].type;
  uVar1._4_4_ = pEVar2[idx].flags;
  pEVar2[idx].field_0.value = 0;
  pEVar2[idx].type = Undefined;
  pEVar2[idx].flags = (QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>)0x0;
  if ((uVar1 >> 0x20 & 1) == 0) {
    if ((uVar1 >> 0x20 & 2) == 0) {
      *(undefined1 **)&__return_storage_ptr__->t = &DAT_aaaaaaaaaaaaaaaa;
      __return_storage_ptr__->n = 0;
      __return_storage_ptr__->container = (QCborContainerPrivate *)0x0;
      __return_storage_ptr__->t = (undefined4)uVar1;
      __return_storage_ptr__->n = (qint64)this_00;
      __return_storage_ptr__->container = (QCborContainerPrivate *)0x0;
    }
    else {
      e.type = (undefined4)uVar1;
      e.flags.super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>.
      super_QFlagsStorage<QtCbor::Element::ValueFlag>.i =
           (QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>)
           (QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>)uVar1._4_4_;
      e.field_0.container = (QCborContainerPrivate *)this_00.value;
      extractAt_complex(__return_storage_ptr__,this,e);
    }
  }
  else if (((undefined4)uVar1 == Tag) && (((this_00.container)->elements).d.size != 2)) {
    deref(this_00.container);
    *(undefined1 **)&__return_storage_ptr__->t = &DAT_aaaaaaaaaaaaaaaa;
    __return_storage_ptr__->n = 0;
    __return_storage_ptr__->container = (QCborContainerPrivate *)0x0;
    __return_storage_ptr__->t = Invalid;
  }
  else {
    *(undefined1 **)&__return_storage_ptr__->t = &DAT_aaaaaaaaaaaaaaaa;
    __return_storage_ptr__->n = 0;
    __return_storage_ptr__->container = (QCborContainerPrivate *)0x0;
    __return_storage_ptr__->t = (undefined4)uVar1;
    __return_storage_ptr__->n = -1;
    __return_storage_ptr__->container = (QCborContainerPrivate *)this_00;
  }
  return __return_storage_ptr__;
}

Assistant:

QCborValue extractAt(qsizetype idx)
    {
        QtCbor::Element e;
        qSwap(e, elements[idx]);

        if (e.flags & QtCbor::Element::IsContainer) {
            if (e.type == QCborValue::Tag && e.container->elements.size() != 2) {
                // invalid tags can be created due to incomplete parsing
                e.container->deref();
                return makeValue(QCborValue::Invalid, 0, nullptr);
            }
            return makeValue(e.type, -1, e.container, MoveContainer);
        } else if (e.flags & QtCbor::Element::HasByteData) {
            return extractAt_complex(e);
        }
        return makeValue(e.type, e.value);
    }